

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> __thiscall
capnp::_::BuilderArena::getSegmentsForOutput(BuilderArena *this)

{
  MultiSegmentState *pMVar1;
  size_t sVar2;
  size_t sVar3;
  ArrayPtr<const_capnp::word> *pAVar4;
  SegmentBuilder *this_00;
  BuilderArena *pBVar5;
  ulong uVar6;
  ArrayPtr<kj::ArrayPtr<const_capnp::word>_> local_c8;
  ArrayPtr<const_capnp::word> local_b8;
  ArrayPtr<const_capnp::word> local_a8;
  Own<capnp::_::SegmentBuilder> *local_98;
  Own<capnp::_::SegmentBuilder> *builder;
  Own<capnp::_::SegmentBuilder> *__end3;
  Own<capnp::_::SegmentBuilder> *__begin3;
  Vector<kj::Own<capnp::_::SegmentBuilder>_> *__range3;
  size_t local_70;
  uint local_64;
  undefined1 local_60 [4];
  uint i;
  ArrayPtr<kj::ArrayPtr<const_capnp::word>_> result;
  size_t local_40;
  size_t local_38;
  Fault local_30;
  Fault f;
  Own<capnp::_::BuilderArena::MultiSegmentState> *segmentState;
  BuilderArena *this_local;
  
  f.exception = (Exception *)
                kj::_::readMaybe<capnp::_::BuilderArena::MultiSegmentState>(&this->moreSegments);
  if (f.exception == (Exception *)0x0) {
    pBVar5 = SegmentBuilder::getArena(&this->segment0);
    if (pBVar5 == (BuilderArena *)0x0) {
      kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::ArrayPtr
                ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&this_local,(void *)0x0);
    }
    else {
      local_b8 = SegmentBuilder::currentlyAllocated(&this->segment0);
      (this->segment0ForOutput).ptr = local_b8.ptr;
      (this->segment0ForOutput).size_ = local_b8.size_;
      local_c8 = kj::arrayPtr<kj::ArrayPtr<capnp::word_const>>(&this->segment0ForOutput,1);
      _this_local = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_c8);
    }
  }
  else {
    pMVar1 = kj::Own<capnp::_::BuilderArena::MultiSegmentState>::get
                       ((Own<capnp::_::BuilderArena::MultiSegmentState> *)f.exception);
    sVar2 = kj::Vector<kj::ArrayPtr<const_capnp::word>_>::size(&pMVar1->forOutput);
    pMVar1 = kj::Own<capnp::_::BuilderArena::MultiSegmentState>::get
                       ((Own<capnp::_::BuilderArena::MultiSegmentState> *)f.exception);
    sVar3 = kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::size(&pMVar1->builders);
    if (sVar2 != sVar3 + 1) {
      pMVar1 = kj::Own<capnp::_::BuilderArena::MultiSegmentState>::get
                         ((Own<capnp::_::BuilderArena::MultiSegmentState> *)f.exception);
      local_38 = kj::Vector<kj::ArrayPtr<const_capnp::word>_>::size(&pMVar1->forOutput);
      pMVar1 = kj::Own<capnp::_::BuilderArena::MultiSegmentState>::get
                         ((Own<capnp::_::BuilderArena::MultiSegmentState> *)f.exception);
      local_40 = kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::size(&pMVar1->builders);
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[82],unsigned_long,unsigned_long>
                (&local_30,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/arena.c++"
                 ,0x109,FAILED,
                 "segmentState->get()->forOutput.size() == segmentState->get()->builders.size() + 1"
                 ,
                 "\"segmentState->forOutput wasn\'t resized correctly when the last builder was added.\", segmentState->get()->forOutput.size(), segmentState->get()->builders.size()"
                 ,(char (*) [82])
                  "segmentState->forOutput wasn\'t resized correctly when the last builder was added."
                 ,&local_38,&local_40);
      kj::_::Debug::Fault::fatal(&local_30);
    }
    pMVar1 = kj::Own<capnp::_::BuilderArena::MultiSegmentState>::get
                       ((Own<capnp::_::BuilderArena::MultiSegmentState> *)f.exception);
    pAVar4 = kj::Vector<kj::ArrayPtr<const_capnp::word>_>::operator[](&pMVar1->forOutput,0);
    pMVar1 = kj::Own<capnp::_::BuilderArena::MultiSegmentState>::get
                       ((Own<capnp::_::BuilderArena::MultiSegmentState> *)f.exception);
    sVar2 = kj::Vector<kj::ArrayPtr<const_capnp::word>_>::size(&pMVar1->forOutput);
    kj::ArrayPtr<kj::ArrayPtr<const_capnp::word>_>::ArrayPtr
              ((ArrayPtr<kj::ArrayPtr<const_capnp::word>_> *)local_60,pAVar4,sVar2);
    local_64 = 0;
    ___range3 = SegmentBuilder::currentlyAllocated(&this->segment0);
    uVar6 = (ulong)local_64;
    local_64 = local_64 + 1;
    pAVar4 = kj::ArrayPtr<kj::ArrayPtr<const_capnp::word>_>::operator[]
                       ((ArrayPtr<kj::ArrayPtr<const_capnp::word>_> *)local_60,uVar6);
    pAVar4->ptr = (word *)__range3;
    pAVar4->size_ = local_70;
    __begin3 = (Own<capnp::_::SegmentBuilder> *)
               kj::Own<capnp::_::BuilderArena::MultiSegmentState>::get
                         ((Own<capnp::_::BuilderArena::MultiSegmentState> *)f.exception);
    __end3 = kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::begin
                       ((Vector<kj::Own<capnp::_::SegmentBuilder>_> *)__begin3);
    builder = kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::end
                        ((Vector<kj::Own<capnp::_::SegmentBuilder>_> *)__begin3);
    for (; __end3 != builder; __end3 = __end3 + 1) {
      local_98 = __end3;
      this_00 = kj::Own<capnp::_::SegmentBuilder>::operator->(__end3);
      local_a8 = SegmentBuilder::currentlyAllocated(this_00);
      uVar6 = (ulong)local_64;
      local_64 = local_64 + 1;
      pAVar4 = kj::ArrayPtr<kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<kj::ArrayPtr<const_capnp::word>_> *)local_60,uVar6);
      pAVar4->ptr = local_a8.ptr;
      pAVar4->size_ = local_a8.size_;
    }
    _this_local = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)local_60);
  }
  return _this_local;
}

Assistant:

kj::ArrayPtr<const kj::ArrayPtr<const word>> BuilderArena::getSegmentsForOutput() {
  // Although this is a read-only method, we shouldn't need to lock a mutex here because if this
  // is called multiple times simultaneously, we should only be overwriting the array with the
  // exact same data.  If the number or size of segments is actually changing due to an activity
  // in another thread, then the caller has a problem regardless of locking here.

  KJ_IF_MAYBE(segmentState, moreSegments) {
    KJ_DASSERT(segmentState->get()->forOutput.size() == segmentState->get()->builders.size() + 1,
        "segmentState->forOutput wasn't resized correctly when the last builder was added.",
        segmentState->get()->forOutput.size(), segmentState->get()->builders.size());

    kj::ArrayPtr<kj::ArrayPtr<const word>> result(
        &segmentState->get()->forOutput[0], segmentState->get()->forOutput.size());
    uint i = 0;
    result[i++] = segment0.currentlyAllocated();
    for (auto& builder: segmentState->get()->builders) {
      result[i++] = builder->currentlyAllocated();
    }
    return result;
  } else {
    if (segment0.getArena() == nullptr) {
      // We haven't actually allocated any segments yet.
      return nullptr;
    } else {
      // We have only one segment so far.
      segment0ForOutput = segment0.currentlyAllocated();
      return kj::arrayPtr(&segment0ForOutput, 1);
    }
  }
}